

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O1

double __thiscall libDAI::NDP::ConstructOptimalAssignments(NDP *this)

{
  size_t *psVar1;
  double dVar2;
  pointer pTVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  _Node *p_Var6;
  ulong uVar7;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  valConf solution;
  pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_40;
  
  iVar4 = (*(this->_g->super_GraphicalModel)._vptr_GraphicalModel[5])();
  uVar9 = CONCAT44(extraout_var,iVar4) - 1;
  pTVar3 = (this->_m_newFacs).
           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(this->_m_newFacs).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 3) *
          0x6db6db6db6db6db7;
  if (uVar9 <= uVar7 && uVar7 - uVar9 != 0) {
    dVar2 = **(double **)&pTVar3[uVar9]._p._p.super__Vector_base<double,_std::allocator<double>_>;
    if ((this->Props).verbose != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"NDP::ConstructOptimalAssignments() - value=",0x2b);
      poVar5 = std::ostream::_M_insert<double>(dVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    uVar8 = 0;
    uVar7 = uVar9;
    do {
      SelectStateForVar(this,uVar7);
      uVar8 = uVar8 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar8 <= uVar9);
    local_40.first = dVar2;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_40.second,&this->_m_bestConfiguration);
    p_Var6 = std::__cxx11::
             list<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
             ::
             _M_create_node<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>const&>
                       ((list<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                         *)&this->_valConfs,&local_40);
    std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
    psVar1 = &(this->_valConfs).
              super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_40.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.second.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_40.second.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.second.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return dVar2;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
}

Assistant:

double NDP::ConstructOptimalAssignments()
    {

        size_t lastVarI =  _g->nrVars()-1;

        //the optimal value is directly given by the factor introduced for
        //the very last variable! - which has 1 local state (the empty one)
        double value = _m_newFacs.at(lastVarI)[0];
        
        if(Props.verbose >= 1)
            cout << "NDP::ConstructOptimalAssignments() - value="<<value<<endl;

        //traverse the variables in reverse order:
        for(size_t i=0; i <= lastVarI; i++)
        {
            //reverse order index:
            size_t rI = lastVarI - i;
            SelectStateForVar(rI);
        }

        valConf solution = make_pair(value, _m_bestConfiguration );
        _valConfs.push_front(solution);

        return(value);
    }